

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int ZSTD_isRLE(BYTE *src,size_t length)

{
  long *plVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  size_t sVar6;
  BYTE *pBVar7;
  
  iVar5 = 1;
  if (length != 1) {
    bVar2 = *src;
    sVar6 = (size_t)((uint)length & 0x1f);
    if (((length & 0x1f) == 0) || (sVar3 = ZSTD_count(src + 1,src,src + sVar6), sVar3 == sVar6 - 1))
    {
      pBVar7 = src + sVar6;
      for (; sVar6 != length; sVar6 = sVar6 + 0x20) {
        uVar4 = 0;
        while (uVar4 < 0x20) {
          plVar1 = (long *)(pBVar7 + uVar4);
          uVar4 = uVar4 + 8;
          if (*plVar1 != (ulong)bVar2 * 0x101010101010101) goto LAB_001b90d2;
        }
        pBVar7 = pBVar7 + 0x20;
      }
    }
    else {
LAB_001b90d2:
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static int ZSTD_isRLE(const BYTE* src, size_t length) {
    const BYTE* ip = src;
    const BYTE value = ip[0];
    const size_t valueST = (size_t)((U64)value * 0x0101010101010101ULL);
    const size_t unrollSize = sizeof(size_t) * 4;
    const size_t unrollMask = unrollSize - 1;
    const size_t prefixLength = length & unrollMask;
    size_t i;
    if (length == 1) return 1;
    /* Check if prefix is RLE first before using unrolled loop */
    if (prefixLength && ZSTD_count(ip+1, ip, ip+prefixLength) != prefixLength-1) {
        return 0;
    }
    for (i = prefixLength; i != length; i += unrollSize) {
        size_t u;
        for (u = 0; u < unrollSize; u += sizeof(size_t)) {
            if (MEM_readST(ip + i + u) != valueST) {
                return 0;
    }   }   }
    return 1;
}